

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

ImplicitProducer * __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::get_or_add_implicit_producer
          (ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
           *this)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  __atomic_flag_data_type _Var3;
  __int_type_conflict _Var4;
  ImplicitProducerHash *pIVar5;
  size_t sVar6;
  __pointer_type pIVar7;
  ulong uVar8;
  long lVar9;
  ImplicitProducerKVP *pIVar10;
  ImplicitProducer *unaff_RBX;
  ulong uVar11;
  int iVar12;
  __pointer_type pIVar13;
  long lVar14;
  long *in_FS_OFFSET;
  bool bVar15;
  bool recycled;
  bool local_41;
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits> *local_40
  ;
  ulong local_38;
  
  uVar2 = *in_FS_OFFSET - 4;
  uVar8 = (uVar2 >> 0x21 ^ uVar2) * -0xae502812aa7333;
  local_38 = (uVar8 >> 0x21 ^ uVar8) * -0x3b314601e57a13ad;
  local_38 = local_38 >> 0x21 ^ local_38;
  pIVar13 = (this->implicitProducerHash)._M_b._M_p;
  for (pIVar5 = pIVar13; uVar8 = local_38, pIVar5 != (__pointer_type)0x0; pIVar5 = pIVar5->prev) {
    do {
      uVar8 = pIVar5->capacity - 1 & uVar8;
      uVar11 = pIVar5->entries[uVar8].key.super___atomic_base<unsigned_long>._M_i;
      if (uVar11 == uVar2) {
        unaff_RBX = pIVar5->entries[uVar8].value;
        iVar12 = 1;
        uVar11 = local_38;
        if (pIVar5 != pIVar13) {
          do {
            uVar8 = pIVar13->capacity - 1 & uVar11;
            if (pIVar13->entries[uVar8].key.super___atomic_base<unsigned_long>._M_i == 0) {
              pIVar10 = pIVar13->entries + uVar8;
              LOCK();
              bVar15 = (pIVar10->key).super___atomic_base<unsigned_long>._M_i == 0;
              if (bVar15) {
                (pIVar10->key).super___atomic_base<unsigned_long>._M_i = uVar2;
              }
              UNLOCK();
              if (!bVar15) goto LAB_00144f63;
              pIVar13->entries[uVar8].value = unaff_RBX;
              bVar15 = false;
            }
            else {
LAB_00144f63:
              uVar8 = uVar8 + 1;
              bVar15 = true;
            }
            uVar11 = uVar8;
          } while (bVar15);
        }
      }
      else {
        iVar12 = 6;
        if (uVar11 != 0) {
          iVar12 = 0;
        }
        uVar8 = uVar8 + (uVar11 != 0);
      }
    } while (iVar12 == 0);
    if (iVar12 != 6) break;
  }
  if (pIVar5 == (__pointer_type)0x0) {
    LOCK();
    paVar1 = &this->implicitProducerHashCount;
    _Var4 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    uVar8 = _Var4 + 1;
    local_40 = this;
    while( true ) {
      if (pIVar13->capacity >> 1 <= uVar8) {
        LOCK();
        _Var3 = (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i;
        (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = true;
        UNLOCK();
        if (_Var3 == false) {
          pIVar13 = (this->implicitProducerHash)._M_b._M_p;
          sVar6 = pIVar13->capacity;
          if (uVar8 < pIVar13->capacity >> 1) {
            (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = false;
          }
          else {
            do {
              uVar11 = sVar6;
              sVar6 = uVar11 * 2;
            } while ((uVar11 & 0x7fffffffffffffff) <= uVar8);
            pIVar7 = (__pointer_type)malloc(uVar11 << 5 | 0x1f);
            if (pIVar7 == (__pointer_type)0x0) {
              LOCK();
              (local_40->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i =
                   (local_40->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i - 1
              ;
              UNLOCK();
              (local_40->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = false
              ;
              unaff_RBX = (ImplicitProducer *)0x0;
            }
            else {
              pIVar7->capacity = sVar6;
              pIVar7->entries =
                   (ImplicitProducerKVP *)
                   ((long)&pIVar7[1].capacity + (ulong)(-((int)pIVar7 + 0x18) & 7));
              if (sVar6 != 0) {
                lVar14 = uVar11 * 2;
                lVar9 = 8;
                do {
                  pIVar10 = pIVar7->entries;
                  *(undefined8 *)
                   ((long)&(pIVar10->key).super___atomic_base<unsigned_long>._M_i + lVar9) = 0;
                  *(undefined8 *)((long)pIVar10 + lVar9 + -8) = 0;
                  lVar9 = lVar9 + 0x10;
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
              pIVar7->prev = pIVar13;
              (local_40->implicitProducerHash)._M_b._M_p = pIVar7;
              (local_40->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = false
              ;
              pIVar13 = pIVar7;
            }
            this = local_40;
            if (pIVar7 == (__pointer_type)0x0) {
              return unaff_RBX;
            }
          }
        }
      }
      if (uVar8 < (pIVar13->capacity >> 2) + (pIVar13->capacity >> 1)) break;
      pIVar13 = (this->implicitProducerHash)._M_b._M_p;
    }
    unaff_RBX = (ImplicitProducer *)recycle_or_create_producer(this,false,&local_41);
    if (unaff_RBX == (ImplicitProducer *)0x0) {
      LOCK();
      (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i =
           (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      unaff_RBX = (ImplicitProducer *)0x0;
    }
    else {
      if (local_41 == true) {
        LOCK();
        (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i =
             (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
      }
      do {
        local_38 = pIVar13->capacity - 1 & local_38;
        if (pIVar13->entries[local_38].key.super___atomic_base<unsigned_long>._M_i == 0) {
          pIVar10 = pIVar13->entries + local_38;
          LOCK();
          bVar15 = (pIVar10->key).super___atomic_base<unsigned_long>._M_i == 0;
          if (bVar15) {
            (pIVar10->key).super___atomic_base<unsigned_long>._M_i = uVar2;
          }
          UNLOCK();
          if (!bVar15) goto LAB_00145127;
          pIVar13->entries[local_38].value = unaff_RBX;
          bVar15 = false;
        }
        else {
LAB_00145127:
          local_38 = local_38 + 1;
          bVar15 = true;
        }
      } while (bVar15);
    }
  }
  return unaff_RBX;
}

Assistant:

ImplicitProducer* get_or_add_implicit_producer()
	{
		// Note that since the data is essentially thread-local (key is thread ID),
		// there's a reduced need for fences (memory ordering is already consistent
		// for any individual thread), except for the current table itself.
		
		// Start by looking for the thread ID in the current and all previous hash tables.
		// If it's not found, it must not be in there yet, since this same thread would
		// have added it previously to one of the tables that we traversed.
		
		// Code and algorithm adapted from http://preshing.com/20130605/the-worlds-simplest-lock-free-hash-table
		
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
		debug::DebugLock lock(implicitProdMutex);
#endif
		
		auto id = details::thread_id();
		auto hashedId = details::hash_thread_id(id);
		
		auto mainHash = implicitProducerHash.load(std::memory_order_acquire);
		for (auto hash = mainHash; hash != nullptr; hash = hash->prev) {
			// Look for the id in this hash
			auto index = hashedId;
			while (true) {		// Not an infinite loop because at least one slot is free in the hash table
				index &= hash->capacity - 1;
				
				auto probedKey = hash->entries[index].key.load(std::memory_order_relaxed);
				if (probedKey == id) {
					// Found it! If we had to search several hashes deep, though, we should lazily add it
					// to the current main hash table to avoid the extended search next time.
					// Note there's guaranteed to be room in the current hash table since every subsequent
					// table implicitly reserves space for all previous tables (there's only one
					// implicitProducerHashCount).
					auto value = hash->entries[index].value;
					if (hash != mainHash) {
						index = hashedId;
						while (true) {
							index &= mainHash->capacity - 1;
							probedKey = mainHash->entries[index].key.load(std::memory_order_relaxed);
							auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
							auto reusable = details::invalid_thread_id2;
							if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed)) ||
								(probedKey == reusable && mainHash->entries[index].key.compare_exchange_strong(reusable, id, std::memory_order_acquire))) {
#else
							if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed))) {
#endif
								mainHash->entries[index].value = value;
								break;
							}
							++index;
						}
					}
					
					return value;
				}
				if (probedKey == details::invalid_thread_id) {
					break;		// Not in this hash table
				}
				++index;
			}
		}
		
		// Insert!
		auto newCount = 1 + implicitProducerHashCount.fetch_add(1, std::memory_order_relaxed);
		while (true) {
			if (newCount >= (mainHash->capacity >> 1) && !implicitProducerHashResizeInProgress.test_and_set(std::memory_order_acquire)) {
				// We've acquired the resize lock, try to allocate a bigger hash table.
				// Note the acquire fence synchronizes with the release fence at the end of this block, and hence when
				// we reload implicitProducerHash it must be the most recent version (it only gets changed within this
				// locked block).
				mainHash = implicitProducerHash.load(std::memory_order_acquire);
				if (newCount >= (mainHash->capacity >> 1)) {
					auto newCapacity = mainHash->capacity << 1;
					while (newCount >= (newCapacity >> 1)) {
						newCapacity <<= 1;
					}
					auto raw = static_cast<char*>((Traits::malloc)(sizeof(ImplicitProducerHash) + std::alignment_of<ImplicitProducerKVP>::value - 1 + sizeof(ImplicitProducerKVP) * newCapacity));
					if (raw == nullptr) {
						// Allocation failed
						implicitProducerHashCount.fetch_add(-1, std::memory_order_relaxed);
						implicitProducerHashResizeInProgress.clear(std::memory_order_relaxed);
						return nullptr;
					}
					
					auto newHash = new (raw) ImplicitProducerHash;
					newHash->capacity = newCapacity;
					newHash->entries = reinterpret_cast<ImplicitProducerKVP*>(details::align_for<ImplicitProducerKVP>(raw + sizeof(ImplicitProducerHash)));
					for (size_t i = 0; i != newCapacity; ++i) {
						new (newHash->entries + i) ImplicitProducerKVP;
						newHash->entries[i].key.store(details::invalid_thread_id, std::memory_order_relaxed);
					}
					newHash->prev = mainHash;
					implicitProducerHash.store(newHash, std::memory_order_release);
					implicitProducerHashResizeInProgress.clear(std::memory_order_release);
					mainHash = newHash;
				}
				else {
					implicitProducerHashResizeInProgress.clear(std::memory_order_release);
				}
			}
			
			// If it's < three-quarters full, add to the old one anyway so that we don't have to wait for the next table
			// to finish being allocated by another thread (and if we just finished allocating above, the condition will
			// always be true)
			if (newCount < (mainHash->capacity >> 1) + (mainHash->capacity >> 2)) {
				bool recycled;
				auto producer = static_cast<ImplicitProducer*>(recycle_or_create_producer(false, recycled));
				if (producer == nullptr) {
					implicitProducerHashCount.fetch_add(-1, std::memory_order_relaxed);
					return nullptr;
				}
				if (recycled) {
					implicitProducerHashCount.fetch_add(-1, std::memory_order_relaxed);
				}
				
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
				producer->threadExitListener.callback = &ConcurrentQueue::implicit_producer_thread_exited_callback;
				producer->threadExitListener.userData = producer;
				details::ThreadExitNotifier::subscribe(&producer->threadExitListener);
#endif
				
				auto index = hashedId;
				while (true) {
					index &= mainHash->capacity - 1;
					auto probedKey = mainHash->entries[index].key.load(std::memory_order_relaxed);
					
					auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
					auto reusable = details::invalid_thread_id2;
					if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed)) ||
						(probedKey == reusable && mainHash->entries[index].key.compare_exchange_strong(reusable, id, std::memory_order_acquire))) {
#else
					if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed))) {
#endif
						mainHash->entries[index].value = producer;
						break;
					}
					++index;
				}
				return producer;
			}
			
			// Hmm, the old hash is quite full and somebody else is busy allocating a new one.
			// We need to wait for the allocating thread to finish (if it succeeds, we add, if not,
			// we try to allocate ourselves).
			mainHash = implicitProducerHash.load(std::memory_order_acquire);
		}
	}
	
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
	void implicit_producer_thread_exited(ImplicitProducer* producer)
	{
		// Remove from thread exit listeners
		details::ThreadExitNotifier::unsubscribe(&producer->threadExitListener);
		
		// Remove from hash
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
		debug::DebugLock lock(implicitProdMutex);
#endif
		auto hash = implicitProducerHash.load(std::memory_order_acquire);
		assert(hash != nullptr);		// The thread exit listener is only registered if we were added to a hash in the first place
		auto id = details::thread_id();
		auto hashedId = details::hash_thread_id(id);
		details::thread_id_t probedKey;
		
		// We need to traverse all the hashes just in case other threads aren't on the current one yet and are
		// trying to add an entry thinking there's a free slot (because they reused a producer)
		for (; hash != nullptr; hash = hash->prev) {
			auto index = hashedId;
			do {
				index &= hash->capacity - 1;
				probedKey = hash->entries[index].key.load(std::memory_order_relaxed);
				if (probedKey == id) {
					hash->entries[index].key.store(details::invalid_thread_id2, std::memory_order_release);
					break;
				}
				++index;
			} while (probedKey != details::invalid_thread_id);		// Can happen if the hash has changed but we weren't put back in it yet, or if we weren't added to this hash in the first place
		}
		
		// Mark the queue as being recyclable
		producer->inactive.store(true, std::memory_order_release);
	}
	
	static void implicit_producer_thread_exited_callback(void* userData)
	{
		auto producer = static_cast<ImplicitProducer*>(userData);
		auto queue = producer->parent;
		queue->implicit_producer_thread_exited(producer);
	}
#endif
	
	//////////////////////////////////
	// Utility functions
	//////////////////////////////////
	
	template<typename U>
	static inline U* create_array(size_t count)
	{
		assert(count > 0);
		auto p = static_cast<U*>((Traits::malloc)(sizeof(U) * count));
		if (p == nullptr) {
			return nullptr;
		}
		
		for (size_t i = 0; i != count; ++i) {
			new (p + i) U();
		}
		return p;
	}
	
	template<typename U>
	static inline void destroy_array(U* p, size_t count)
	{
		if (p != nullptr) {
			assert(count > 0);
			for (size_t i = count; i != 0; ) {
				(p + --i)->~U();
			}
			(Traits::free)(p);
		}
	}
	
	template<typename U>
	static inline U* create()
	{
		auto p = (Traits::malloc)(sizeof(U));
		return p != nullptr ? new (p) U : nullptr;
	}
	
	template<typename U, typename A1>
	static inline U* create(A1&& a1)
	{
		auto p = (Traits::malloc)(sizeof(U));
		return p != nullptr ? new (p) U(std::forward<A1>(a1)) : nullptr;
	}
	
	template<typename U>
	static inline void destroy(U* p)
	{
		if (p != nullptr) {
			p->~U();
		}
		(Traits::free)(p);
	}

private:
	std::atomic<ProducerBase*> producerListTail;
	std::atomic<std::uint32_t> producerCount;
	
	std::atomic<size_t> initialBlockPoolIndex;
	Block* initialBlockPool;
	size_t initialBlockPoolSize;
	
#if !MCDBGQ_USEDEBUGFREELIST
	FreeList<Block> freeList;
#else
	debug::DebugFreeList<Block> freeList;
#endif
	
	std::atomic<ImplicitProducerHash*> implicitProducerHash;
	std::atomic<size_t> implicitProducerHashCount;		// Number of slots logically used
	ImplicitProducerHash initialImplicitProducerHash;
	std::array<ImplicitProducerKVP, INITIAL_IMPLICIT_PRODUCER_HASH_SIZE> initialImplicitProducerHashEntries;
	std::atomic_flag implicitProducerHashResizeInProgress;
	
	std::atomic<std::uint32_t> nextExplicitConsumerId;
	std::atomic<std::uint32_t> globalExplicitConsumerOffset;
	
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
	debug::DebugMutex implicitProdMutex;
#endif
	
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
	std::atomic<ExplicitProducer*> explicitProducers;
	std::atomic<ImplicitProducer*> implicitProducers;
#endif
};


template<typename T, typename Traits>
ProducerToken::ProducerToken(ConcurrentQueue<T, Traits>& queue)
	: producer(queue.recycle_or_create_producer(true))
{
	if (producer != nullptr) {
		producer->token = this;
	}
}

template<typename T, typename Traits>
ProducerToken::ProducerToken(BlockingConcurrentQueue<T, Traits>& queue)
	: producer(reinterpret_cast<ConcurrentQueue<T, Traits>*>(&queue)->recycle_or_create_producer(true))
{
	if (producer != nullptr) {
		producer->token = this;
	}
}

template<typename T, typename Traits>
ConsumerToken::ConsumerToken(ConcurrentQueue<T, Traits>& queue)
	: itemsConsumedFromCurrent(0), currentProducer(nullptr), desiredProducer(nullptr)
{
	initialOffset = queue.nextExplicitConsumerId.fetch_add(1, std::memory_order_release);
	lastKnownGlobalOffset = -1;
}

template<typename T, typename Traits>
ConsumerToken::ConsumerToken(BlockingConcurrentQueue<T, Traits>& queue)
	: itemsConsumedFromCurrent(0), currentProducer(nullptr), desiredProducer(nullptr)
{
	initialOffset = reinterpret_cast<ConcurrentQueue<T, Traits>*>(&queue)->nextExplicitConsumerId.fetch_add(1, std::memory_order_release);
	lastKnownGlobalOffset = -1;
}

template<typename T, typename Traits>
inline void swap(ConcurrentQueue<T, Traits>& a, ConcurrentQueue<T, Traits>& b) MOODYCAMEL_NOEXCEPT
{
	a.swap(b);
}

inline void swap(ProducerToken& a, ProducerToken& b) MOODYCAMEL_NOEXCEPT
{
	a.swap(b);
}

inline void swap(ConsumerToken& a, ConsumerToken& b) MOODYCAMEL_NOEXCEPT
{
	a.swap(b);
}

template<typename T, typename Traits>
inline void swap(typename ConcurrentQueue<T, Traits>::ImplicitProducerKVP& a, typename ConcurrentQueue<T, Traits>::ImplicitProducerKVP& b) MOODYCAMEL_NOEXCEPT
{
	a.swap(b);
}

}